

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_core.cpp
# Opt level: O2

void QTest::qWait(milliseconds msecs)

{
  long lVar1;
  bool bVar2;
  nanoseconds in_RCX;
  long in_FS_OFFSET;
  QDeadlineTimer deadline;
  milliseconds msecs_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msecs_00.__r = (rep)&DAT_aaaaaaaaaaaaaaaa;
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
            ((QDeadlineTimer *)&stack0xffffffffffffffb8,
             (duration<long,_std::ratio<1L,_1000L>_>)msecs.__r,PreciseTimer);
  do {
    deadline.t2 = (int)in_RCX.__r;
    deadline.type = (int)((ulong)in_RCX.__r >> 0x20);
    deadline.t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::processEvents
              ((QCoreApplication *)0x0,
               (QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)SUB84(msecs_00.__r,0),deadline
              );
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    if (((undefined1 *)msecs_00.__r == (undefined1 *)0x7fffffffffffffff) ||
       (in_RCX = QDeadlineTimer::remainingTimeAsDuration((QDeadlineTimer *)&stack0xffffffffffffffb8)
       , (ulong)((in_RCX.__r / 1000000) * 1000000 < in_RCX.__r) + in_RCX.__r / 1000000 == 0)) break;
    qSleep(msecs_00);
    bVar2 = QDeadlineTimer::hasExpired((QDeadlineTimer *)&stack0xffffffffffffffb8);
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT void QTest::qWait(std::chrono::milliseconds msecs)
{
    // Ideally this method would be implemented in terms of qWaitFor(), with a
    // predicate that always returns false, but qWaitFor() uses the 1-arg overload
    // of processEvents(), which doesn't handle events posted in this round of event
    // processing, which, together with the 10ms qSleep() after every processEvents(),
    // lead to a 10x slow-down in some webengine tests.

    Q_ASSERT(QCoreApplication::instance());

    using namespace std::chrono;

    QDeadlineTimer deadline(msecs, Qt::PreciseTimer);

    do {
        QCoreApplication::processEvents(QEventLoop::AllEvents, deadline);
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        // If dealine is Forever, processEvents() has already looped forever
        if (deadline.isForever())
            break;

        msecs = ceil<milliseconds>(deadline.remainingTimeAsDuration());
        if (msecs == 0ms)
            break;

        QTest::qSleep(std::min(10ms, msecs));
    } while (!deadline.hasExpired());
}